

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_sv.c
# Opt level: O3

uint64_t dtl_sv_to_u64(dtl_sv_t *self,_Bool *ok)

{
  float fVar1;
  double dVar2;
  uint uVar3;
  dtl_svx_t *pdVar4;
  ulong uVar5;
  ulong uVar6;
  _Bool _Var7;
  
  if (self == (dtl_sv_t *)0x0) goto switchD_001049a8_default;
  switch(self->u32Flags >> 4 & 0xf) {
  case 1:
    uVar3 = (self->pAny->val).i32;
    uVar5 = 0;
    _Var7 = -1 < (int)uVar3;
    if (_Var7) {
      uVar5 = (ulong)uVar3;
    }
    goto LAB_00104a4e;
  case 2:
    uVar5 = (ulong)(self->pAny->val).u32;
    break;
  case 3:
    pdVar4 = self->pAny;
    if (-1 < (pdVar4->val).i32) goto LAB_001049f4;
  default:
switchD_001049a8_default:
    _Var7 = false;
    uVar5 = 0;
    goto LAB_00104a4e;
  case 4:
    pdVar4 = self->pAny;
LAB_001049f4:
    uVar5 = (pdVar4->val).i64;
    break;
  case 5:
    fVar1 = (self->pAny->val).flt;
    if (fVar1 < 0.0) goto switchD_001049a8_default;
    uVar5 = (ulong)fVar1;
    uVar6 = (ulong)(fVar1 - 9.223372e+18);
LAB_00104a42:
    uVar5 = uVar6 & (long)uVar5 >> 0x3f | uVar5;
    break;
  case 6:
    dVar2 = (self->pAny->val).dbl;
    if (0.0 <= dVar2) {
      uVar5 = (ulong)dVar2;
      uVar6 = (ulong)(dVar2 - 9.223372036854776e+18);
      goto LAB_00104a42;
    }
    goto switchD_001049a8_default;
  case 7:
    uVar5 = (ulong)(self->pAny->val).cr;
    break;
  case 8:
    uVar5 = (ulong)(byte)(self->pAny->val).cr;
  }
  _Var7 = true;
LAB_00104a4e:
  if (ok != (_Bool *)0x0) {
    *ok = _Var7;
  }
  return uVar5;
}

Assistant:

uint64_t dtl_sv_to_u64(const dtl_sv_t *self, bool *ok)
{
   bool success = false;
   uint64_t retval = 0u;

   if(self != 0)
   {
      switch(dtl_sv_type(self)){
      case DTL_SV_NONE:
         break;
      case DTL_SV_I32:
         if (self->pAny->val.i32 >= 0)
         {
            retval = (uint64_t)self->pAny->val.i32;
            success = true;
         }
         break;         break;
      case DTL_SV_U32:
         retval = (uint64_t) self->pAny->val.u32;
         success = true;
         break;
      case DTL_SV_I64:
         if (self->pAny->val.i32 >= 0)
         {
            retval = (uint64_t)self->pAny->val.i64;
            success = true;
         }
         break;         break;
      case DTL_SV_U64:
         retval = self->pAny->val.u64;
         success = true;
         break;
      case DTL_SV_FLT:
         if (self->pAny->val.flt >= 0.0)
         {
            retval = (uint64_t)self->pAny->val.flt;
            success = true;
         }
         break;
      case DTL_SV_DBL:
         if (self->pAny->val.dbl >= 0.0)
         {
            retval = (uint64_t)self->pAny->val.dbl;
            success = true;
         }
         break;
      case DTL_SV_BOOL:
         retval = (uint64_t) self->pAny->val.bl;
         success = true;
         break;
      case DTL_SV_CHAR:
         retval = (uint64_t)self->pAny->val.cr;
         success = true;
         break;
      case DTL_SV_STR:
         break;
      case DTL_SV_PTR:
         break;
      case DTL_SV_DV:
         break;
      case DTL_SV_BYTES:
         break;
      case DTL_SV_BYTEARRAY:
         break;
      }
   }
   if (ok != 0)
   {
      *ok = success;
   }
   return retval;
}